

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

void __thiscall
soul::SourceCodeUtilities::findASTObjectAt::FindLocationVisitor::~FindLocationVisitor
          (FindLocationVisitor *this)

{
  FindLocationVisitor *this_local;
  
  ~FindLocationVisitor(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto distance = target - o.context.location.location.getAddress();

            if (distance == 0
                 || (distance > 0
                      && result != nullptr
                      && distance < target - result->context.location.location.getAddress()))
                result = o;
        }